

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

void __thiscall
QTableWidgetPrivate::dataChanged
          (QTableWidgetPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  QTableModel *this_00;
  int column;
  SortOrder order;
  
  if ((((((this->super_QTableViewPrivate).sortingEnabled == true) && (-1 < topLeft->r)) &&
       (-1 < topLeft->c)) &&
      (((topLeft->m).ptr != (QAbstractItemModel *)0x0 && (-1 < bottomRight->r)))) &&
     ((-1 < bottomRight->c && ((bottomRight->m).ptr != (QAbstractItemModel *)0x0)))) {
    column = QHeaderView::sortIndicatorSection((this->super_QTableViewPrivate).horizontalHeader);
    if ((topLeft->c <= column) && (column <= bottomRight->c)) {
      order = QHeaderView::sortIndicatorOrder((this->super_QTableViewPrivate).horizontalHeader);
      this_00 = (QTableModel *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
      QTableModel::ensureSorted(this_00,column,order,topLeft->r,bottomRight->r);
      return;
    }
  }
  return;
}

Assistant:

void QTableWidgetPrivate::dataChanged(const QModelIndex &topLeft,
                                      const QModelIndex &bottomRight)
{
    if (sortingEnabled && topLeft.isValid() && bottomRight.isValid()) {
        int column = horizontalHeader->sortIndicatorSection();
        if (column >= topLeft.column() && column <= bottomRight.column()) {
            Qt::SortOrder order = horizontalHeader->sortIndicatorOrder();
            tableModel()->ensureSorted(column, order, topLeft.row(), bottomRight.row());
        }
    }
}